

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOutput.cpp
# Opt level: O1

void __thiscall TestOutput::printFileAndLineForFailure(TestOutput *this,TestFailure *failure)

{
  int lineNumber;
  char *pcVar1;
  SimpleString SStack_28;
  SimpleString local_20;
  
  (*failure->_vptr_TestFailure[2])(&local_20);
  lineNumber = (*failure->_vptr_TestFailure[5])(failure);
  printErrorInFileOnLineFormattedForWorkingEnvironment(this,&local_20,lineNumber);
  SimpleString::~SimpleString(&local_20);
  (*failure->_vptr_TestFailure[3])(&SStack_28,failure);
  (*this->_vptr_TestOutput[0xb])(this," Failure in ");
  pcVar1 = SimpleString::asCharString(&SStack_28);
  (*this->_vptr_TestOutput[0xb])(this,pcVar1);
  SimpleString::~SimpleString(&SStack_28);
  return;
}

Assistant:

void TestOutput::printFileAndLineForFailure(const TestFailure& failure)
{
    printErrorInFileOnLineFormattedForWorkingEnvironment(failure.getFileName(), failure.getFailureLineNumber());
    printFailureInTest(failure.getTestName());
}